

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O3

cubeb_resampler *
cubeb_resampler_create
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality,cubeb_resampler_reclock reclock)

{
  uint32_t uVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  cubeb_log_level cVar5;
  cubeb_stream_params *pcVar6;
  cubeb_resampler *pcVar7;
  cubeb_resampler_speex_one_way<float> *this;
  cubeb_resampler_speex_one_way<float> *this_00;
  delay_line<float> *pdVar8;
  cubeb_data_callback p_Var9;
  cubeb_log_callback p_Var10;
  passthrough_resampler<float> *this_01;
  code *pcVar11;
  uint32_t uVar12;
  uint source_rate;
  delay_line<float> *pdStackY_40;
  delay_line<float> *pdStackY_38;
  
  pcVar6 = input_params;
  if (input_params == (cubeb_stream_params *)0x0) {
    pcVar6 = output_params;
  }
  if (pcVar6->format != CUBEB_SAMPLE_FLOAT32LE) {
    if (pcVar6->format != CUBEB_SAMPLE_S16LE) {
      return (cubeb_resampler *)0x0;
    }
    pcVar7 = cubeb_resampler_create_internal<short>
                       (stream,input_params,output_params,target_rate,callback,user_ptr,quality,
                        reclock);
    return pcVar7;
  }
  pdStackY_38 = (delay_line<float> *)0x0;
  pdStackY_40 = (delay_line<float> *)0x0;
  if (input_params == (cubeb_stream_params *)0x0) {
    if (output_params != (cubeb_stream_params *)0x0) goto LAB_001141b2;
    this = (cubeb_resampler_speex_one_way<float> *)0x0;
LAB_001143b5:
    cVar5 = cubeb_log_get_level();
    if ((0 < (int)cVar5) && (p_Var10 = cubeb_log_get_callback(), p_Var10 != (cubeb_log_callback)0x0)
       ) {
      cubeb_log_internal("cubeb_resampler_internal.h",0x267,
                         "Resampling output (%dHz) to target and input rate of %dHz",
                         (ulong)output_params->rate,target_rate);
    }
    this_01 = (passthrough_resampler<float> *)operator_new(0x48);
    pdVar8 = pdStackY_38;
    pdStackY_38 = (delay_line<float> *)0x0;
    (this_01->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b960;
    *(delay_line<float> **)&this_01->super_processor = pdVar8;
    this_01->stream = (cubeb_stream *)this;
    (this_01->internal_input_buffer).data_ = (float *)stream;
    (this_01->internal_input_buffer).capacity_ = (size_t)callback;
    (this_01->internal_input_buffer).length_ = (size_t)user_ptr;
    *(undefined1 *)&this_01->sample_rate = 0;
    if (this == (cubeb_resampler_speex_one_way<float> *)0x0 && pdVar8 == (delay_line<float> *)0x0)
    goto LAB_001145b8;
    pcVar11 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
              ::fill_internal_duplex;
    if (pdVar8 == (delay_line<float> *)0x0) {
      pcVar11 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                ::fill_internal_input;
    }
    if (this == (cubeb_resampler_speex_one_way<float> *)0x0) {
      pcVar11 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                ::fill_internal_input;
    }
    p_Var9 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
             ::fill_internal_output;
    if (pdVar8 != (delay_line<float> *)0x0) {
      p_Var9 = pcVar11;
    }
  }
  else {
    source_rate = input_params->rate;
    if (output_params != (cubeb_stream_params *)0x0 && source_rate == target_rate) {
LAB_001141b2:
      if (output_params->rate == target_rate) {
LAB_001141b8:
        cVar5 = cubeb_log_get_level();
        if ((0 < (int)cVar5) &&
           (p_Var10 = cubeb_log_get_callback(), p_Var10 != (cubeb_log_callback)0x0)) {
          cubeb_log_internal("cubeb_resampler_internal.h",0x229,
                             "Input and output sample-rate match, target rate of %dHz",target_rate);
        }
        this_01 = (passthrough_resampler<float> *)operator_new(0x48);
        if (input_params == (cubeb_stream_params *)0x0) {
          uVar12 = 0;
        }
        else {
          uVar12 = input_params->channels;
        }
        passthrough_resampler<float>::passthrough_resampler
                  (this_01,stream,callback,user_ptr,uVar12,target_rate);
        goto LAB_001145b8;
      }
LAB_0011420c:
      uVar12 = output_params->rate;
      if (uVar12 == target_rate) {
        this = (cubeb_resampler_speex_one_way<float> *)0x0;
      }
      else {
        this = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
        iVar3 = -1;
        if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
          iVar3 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
        }
        cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                  (this,output_params->channels,target_rate,uVar12,iVar3);
      }
      if (input_params != (cubeb_stream_params *)0x0) {
        source_rate = input_params->rate;
        bVar2 = true;
        goto LAB_0011426e;
      }
      bVar2 = true;
LAB_0011432c:
      if (this == (cubeb_resampler_speex_one_way<float> *)0x0) {
        this = (cubeb_resampler_speex_one_way<float> *)0x0;
      }
      else if (bVar2 && input_params != (cubeb_stream_params *)0x0) {
        pdVar8 = (delay_line<float> *)operator_new(0x48);
        iVar3 = speex_resampler_get_output_latency(this->speex_resampler);
        uVar4 = iVar3 + this->additional_latency;
        uVar12 = input_params->channels;
        uVar1 = output_params->rate;
        (pdVar8->super_processor).channels = uVar12;
        pdVar8->length = uVar4;
        pdVar8->leftover_samples = 0;
        (pdVar8->delay_output_buffer).capacity_ = 0;
        (pdVar8->delay_output_buffer).length_ = 0;
        (pdVar8->delay_input_buffer).length_ = 0;
        (pdVar8->delay_output_buffer).data_ = (float *)0x0;
        (pdVar8->delay_input_buffer).data_ = (float *)0x0;
        (pdVar8->delay_input_buffer).capacity_ = 0;
        pdVar8->sample_rate = uVar1;
        auto_array<float>::push_silence(&pdVar8->delay_input_buffer,(ulong)(uVar12 * uVar4));
        pdStackY_38 = pdVar8;
      }
      goto LAB_001143b5;
    }
    if (output_params != (cubeb_stream_params *)0x0) goto LAB_0011420c;
    if (source_rate == target_rate) goto LAB_001141b8;
    this = (cubeb_resampler_speex_one_way<float> *)0x0;
    bVar2 = false;
LAB_0011426e:
    if (source_rate == target_rate) goto LAB_0011432c;
    this_00 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
    iVar3 = -1;
    if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
      iVar3 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
    }
    cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
              (this_00,input_params->channels,source_rate,target_rate,iVar3);
    if ((bool)(bVar2 & input_params != (cubeb_stream_params *)0x0 &
              this == (cubeb_resampler_speex_one_way<float> *)0x0)) {
      pdVar8 = (delay_line<float> *)operator_new(0x48);
      iVar3 = speex_resampler_get_output_latency(this_00->speex_resampler);
      uVar4 = iVar3 + this_00->additional_latency;
      uVar12 = output_params->rate;
      uVar1 = output_params->channels;
      (pdVar8->super_processor).channels = uVar1;
      pdVar8->length = uVar4;
      pdVar8->leftover_samples = 0;
      (pdVar8->delay_output_buffer).capacity_ = 0;
      (pdVar8->delay_output_buffer).length_ = 0;
      (pdVar8->delay_input_buffer).length_ = 0;
      (pdVar8->delay_output_buffer).data_ = (float *)0x0;
      (pdVar8->delay_input_buffer).data_ = (float *)0x0;
      (pdVar8->delay_input_buffer).capacity_ = 0;
      pdVar8->sample_rate = uVar12;
      auto_array<float>::push_silence(&pdVar8->delay_input_buffer,(ulong)(uVar1 * uVar4));
      pdStackY_40 = pdVar8;
LAB_0011451d:
      cVar5 = cubeb_log_get_level();
      if ((0 < (int)cVar5) &&
         (p_Var10 = cubeb_log_get_callback(), p_Var10 != (cubeb_log_callback)0x0)) {
        cubeb_log_internal("cubeb_resampler_internal.h",0x260,
                           "Resampling input (%d) to target and output rate of %dHz",
                           (ulong)input_params->rate,(ulong)target_rate);
      }
      this_01 = (passthrough_resampler<float> *)operator_new(0x48);
      pdVar8 = pdStackY_40;
      pdStackY_40 = (delay_line<float> *)0x0;
      (this_01->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b928;
      *(cubeb_resampler_speex_one_way<float> **)&this_01->super_processor = this_00;
      this_01->stream = (cubeb_stream *)pdVar8;
      (this_01->internal_input_buffer).data_ = (float *)stream;
      (this_01->internal_input_buffer).capacity_ = (size_t)callback;
      (this_01->internal_input_buffer).length_ = (size_t)user_ptr;
      *(undefined1 *)&this_01->sample_rate = 0;
      pcVar11 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                ::fill_internal_duplex;
      if (pdVar8 == (delay_line<float> *)0x0) {
        pcVar11 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                  ::fill_internal_input;
      }
      this_01->data_callback = pcVar11;
      this_01->user_ptr = (void *)0x0;
      goto LAB_001145b8;
    }
    if (this == (cubeb_resampler_speex_one_way<float> *)0x0) goto LAB_0011451d;
    cVar5 = cubeb_log_get_level();
    if ((0 < (int)cVar5) && (p_Var10 = cubeb_log_get_callback(), p_Var10 != (cubeb_log_callback)0x0)
       ) {
      cubeb_log_internal("cubeb_resampler_internal.h",0x259,
                         "Resampling input (%d) and output (%d) to target rate of %dHz",
                         (ulong)input_params->rate,(ulong)output_params->rate,(ulong)target_rate);
    }
    this_01 = (passthrough_resampler<float> *)operator_new(0x48);
    (this_01->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b8f0;
    *(cubeb_resampler_speex_one_way<float> **)&this_01->super_processor = this_00;
    this_01->stream = (cubeb_stream *)this;
    (this_01->internal_input_buffer).data_ = (float *)stream;
    (this_01->internal_input_buffer).capacity_ = (size_t)callback;
    (this_01->internal_input_buffer).length_ = (size_t)user_ptr;
    *(undefined1 *)&this_01->sample_rate = 0;
    p_Var9 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
             ::fill_internal_duplex;
  }
  this_01->data_callback = p_Var9;
  this_01->user_ptr = (void *)0x0;
LAB_001145b8:
  if (pdStackY_40 != (delay_line<float> *)0x0) {
    std::default_delete<delay_line<float>_>::operator()
              ((default_delete<delay_line<float>_> *)&pdStackY_40,pdStackY_40);
  }
  if (pdStackY_38 != (delay_line<float> *)0x0) {
    std::default_delete<delay_line<float>_>::operator()
              ((default_delete<delay_line<float>_> *)&pdStackY_38,pdStackY_38);
  }
  return &this_01->super_cubeb_resampler;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create(cubeb_stream * stream,
                       cubeb_stream_params * input_params,
                       cubeb_stream_params * output_params,
                       unsigned int target_rate, cubeb_data_callback callback,
                       void * user_ptr, cubeb_resampler_quality quality,
                       cubeb_resampler_reclock reclock)
{
  cubeb_sample_format format;

  assert(input_params || output_params);

  if (input_params) {
    format = input_params->format;
  } else {
    format = output_params->format;
  }

  switch (format) {
  case CUBEB_SAMPLE_S16NE:
    return cubeb_resampler_create_internal<short>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  case CUBEB_SAMPLE_FLOAT32NE:
    return cubeb_resampler_create_internal<float>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  default:
    assert(false);
    return nullptr;
  }
}